

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_internal.h
# Opt level: O3

int exploration::generate_softmax<ACTION_SCORE::score_iterator,ACTION_SCORE::score_iterator>
              (float lambda,long scores_first,long scores_last,long param_4,long param_5)

{
  float fVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  float fVar13;
  undefined4 local_34;
  
  uVar6 = *(ulong *)(scores_first + 8);
  iVar3 = 1;
  if (uVar6 <= *(ulong *)(scores_last + 8)) {
    uVar4 = *(ulong *)(param_5 + 8);
    uVar11 = *(ulong *)(param_4 + 8);
    if (uVar11 <= uVar4) {
      uVar5 = (long)(*(ulong *)(scores_last + 8) - uVar6) >> 3;
      uVar10 = (long)(uVar4 - uVar11) >> 3;
      if (uVar5 != uVar10) {
        if (uVar10 < uVar5) {
          uVar5 = uVar10;
        }
        *(ulong *)(scores_last + 8) = uVar6 + uVar5 * 8;
        uVar4 = uVar5 * 8 + *(long *)(param_4 + 8);
        uVar6 = uVar4;
        if (uVar4 != *(ulong *)(param_5 + 8)) {
          do {
            *(undefined4 *)(uVar6 + 4) = 0;
            uVar6 = uVar6 + 8;
          } while (uVar6 != *(ulong *)(param_5 + 8));
        }
        *(ulong *)(param_5 + 8) = uVar4;
        uVar11 = *(ulong *)(param_4 + 8);
      }
      if (uVar4 != uVar11) {
        lVar12 = *(long *)(scores_first + 8);
        lVar2 = *(long *)(scores_last + 8);
        lVar7 = lVar12 + 8;
        lVar8 = lVar12;
        lVar9 = lVar12;
        if (lVar7 != lVar2 && lVar12 != lVar2) {
          do {
            lVar8 = lVar7;
            if (*(float *)(lVar7 + 4) < *(float *)(lVar9 + 4) ||
                *(float *)(lVar7 + 4) == *(float *)(lVar9 + 4)) {
              lVar8 = lVar9;
            }
            lVar7 = lVar7 + 8;
            lVar9 = lVar8;
          } while (lVar7 != lVar2);
        }
        if (lVar12 == *(long *)(scores_last + 8)) {
          local_34 = 0.0;
        }
        else {
          fVar1 = *(float *)(lVar8 + 4);
          local_34 = 0.0;
          do {
            uVar6 = uVar11 + 8;
            fVar13 = expf((*(float *)(lVar12 + 4) - fVar1) * lambda);
            local_34 = local_34 + fVar13;
            *(float *)(uVar11 + 4) = fVar13;
            uVar4 = uVar6;
            if (uVar6 == *(ulong *)(param_5 + 8)) break;
            lVar12 = lVar12 + 8;
            uVar4 = *(ulong *)(param_5 + 8);
            uVar11 = uVar6;
          } while (lVar12 != *(long *)(scores_last + 8));
        }
        uVar6 = *(ulong *)(param_4 + 8);
        iVar3 = 0;
        if (uVar6 != uVar4) {
          do {
            *(float *)(uVar6 + 4) = *(float *)(uVar6 + 4) / local_34;
            uVar6 = uVar6 + 8;
            iVar3 = 0;
          } while (uVar6 != *(ulong *)(param_5 + 8));
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int generate_softmax(float lambda, InputIt scores_first, InputIt scores_last, std::input_iterator_tag /* scores_tag */, OutputIt pdf_first, OutputIt pdf_last, std::random_access_iterator_tag /* pdf_tag */)
  {
    if (scores_last < scores_first || pdf_last < pdf_first)
      return E_EXPLORATION_BAD_RANGE;

    size_t num_actions_scores = scores_last - scores_first;
    size_t num_actions_pdf = pdf_last - pdf_first;

    if (num_actions_scores != num_actions_pdf)
    {
      // fallback to the minimum
      scores_last = scores_first + ((std::min)(num_actions_scores, num_actions_pdf));
      OutputIt pdf_new_last = pdf_first + ((std::min)(num_actions_scores, num_actions_pdf));

      // zero out pdf
      for (OutputIt d = pdf_new_last; d != pdf_last; ++d)
        *d = 0;

      pdf_last = pdf_new_last;
    }

    if (pdf_last - pdf_first == 0)
      return E_EXPLORATION_BAD_RANGE;

    float norm = 0.;
    float max_score = *std::max_element(scores_first, scores_last);

    InputIt s = scores_first;
    for (OutputIt d = pdf_first; d != pdf_last && s != scores_last; ++d, ++s)
    {
      float prob = exp(lambda*(*s - max_score));
      norm += prob;

      *d = prob;
    }

    // normalize
    for (OutputIt d = pdf_first; d != pdf_last; ++d)
      *d /= norm;

    return S_EXPLORATION_OK;
  }